

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O3

string * __thiscall
tinyusdz::to_string_abi_cxx11_
          (string *__return_storage_ptr__,tinyusdz *this,Material *material,uint32_t indent,
          bool closing_brace)

{
  bool bVar1;
  ostream *poVar2;
  ulong uVar3;
  ulong uVar4;
  uint32_t n;
  Specifier s;
  uint32_t n_00;
  uint32_t extraout_EDX;
  uint32_t extraout_EDX_00;
  uint32_t uVar5;
  uint32_t extraout_EDX_01;
  uint32_t extraout_EDX_02;
  uint32_t extraout_EDX_03;
  uint32_t extraout_EDX_04;
  uint32_t n_01;
  uint32_t extraout_EDX_05;
  uint32_t n_02;
  uint32_t extraout_EDX_06;
  uint32_t n_03;
  uint32_t extraout_EDX_07;
  uint32_t extraout_EDX_08;
  Path *p;
  Path *extraout_RDX;
  Path *extraout_RDX_00;
  Path *extraout_RDX_01;
  Path *extraout_RDX_02;
  Path *p_00;
  Path *extraout_RDX_03;
  Path *extraout_RDX_04;
  Path *extraout_RDX_05;
  Path *extraout_RDX_06;
  Path *p_01;
  Path *extraout_RDX_07;
  Path *extraout_RDX_08;
  Path *extraout_RDX_09;
  Path *extraout_RDX_10;
  Path *pPVar6;
  long lVar7;
  uint indent_00;
  ulong uVar8;
  long lVar9;
  stringstream ss;
  string local_218;
  uint local_1f4;
  ulong local_1f0;
  string *local_1e8;
  uint32_t local_1dc;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  uVar8 = (ulong)material & 0xffffffff;
  local_1dc = indent;
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  pprint::Indent_abi_cxx11_(&local_218,(pprint *)((ulong)material & 0xffffffff),n);
  poVar2 = ::std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,local_218._M_dataplus._M_p,local_218._M_string_length);
  to_string_abi_cxx11_(&local_1d8,(tinyusdz *)(ulong)*(uint *)(this + 0x20),s);
  poVar2 = ::std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar2," Material \"",0xb);
  poVar2 = ::std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,*(char **)this,*(long *)(this + 8));
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\"\n",2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  bVar1 = PrimMetas::authored((PrimMetas *)(this + 0x30));
  uVar5 = n_00;
  if (bVar1) {
    pprint::Indent_abi_cxx11_(&local_218,(pprint *)((ulong)material & 0xffffffff),n_00);
    poVar2 = ::std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,local_218._M_dataplus._M_p,local_218._M_string_length);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar2,"(\n",2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
    }
    print_prim_metas_abi_cxx11_
              (&local_218,this + 0x30,(PrimMeta *)(ulong)((int)material + 1),indent);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_218._M_dataplus._M_p,local_218._M_string_length);
    uVar5 = extraout_EDX;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      uVar5 = extraout_EDX_00;
    }
    pprint::Indent_abi_cxx11_(&local_218,(pprint *)((ulong)material & 0xffffffff),uVar5);
    poVar2 = ::std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,local_218._M_dataplus._M_p,local_218._M_string_length);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar2,")\n",2);
    uVar5 = extraout_EDX_01;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      uVar5 = extraout_EDX_02;
    }
  }
  pprint::Indent_abi_cxx11_(&local_218,(pprint *)((ulong)material & 0xffffffff),uVar5);
  poVar2 = ::std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,local_218._M_dataplus._M_p,local_218._M_string_length);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar2,"{\n",2);
  uVar5 = extraout_EDX_03;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
    uVar5 = extraout_EDX_04;
  }
  if (this[0x748] == (tinyusdz)0x1) {
    local_1f4 = (int)material + 1;
    pprint::Indent_abi_cxx11_(&local_218,(pprint *)(ulong)local_1f4,uVar5);
    poVar2 = ::std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,local_218._M_dataplus._M_p,local_218._M_string_length);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,"token outputs:surface.connect ",0x1e);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
    }
    if (*(long *)(this + 0x738) - *(long *)(this + 0x730) == 0xd0) {
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"= ",2);
      (anonymous_namespace)::pquote_abi_cxx11_
                (&local_218,*(_anonymous_namespace_ **)(this + 0x730),p);
      ::std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,local_218._M_dataplus._M_p,local_218._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
    }
    else if (1 < (ulong)((*(long *)(this + 0x738) - *(long *)(this + 0x730) >> 4) *
                        0x4ec4ec4ec4ec4ec5)) {
      local_1f0 = uVar8;
      local_1e8 = __return_storage_ptr__;
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"= [",3);
      lVar7 = *(long *)(this + 0x730);
      if (*(long *)(this + 0x738) != lVar7) {
        lVar9 = 0;
        uVar8 = 0;
        pPVar6 = extraout_RDX;
        do {
          (anonymous_namespace)::pquote_abi_cxx11_
                    (&local_218,(_anonymous_namespace_ *)(lVar7 + lVar9),pPVar6);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    (local_1a8,local_218._M_dataplus._M_p,local_218._M_string_length);
          pPVar6 = extraout_RDX_00;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_218._M_dataplus._M_p != &local_218.field_2) {
            operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
            pPVar6 = extraout_RDX_01;
          }
          lVar7 = *(long *)(this + 0x730);
          uVar3 = (*(long *)(this + 0x738) - lVar7 >> 4) * 0x4ec4ec4ec4ec4ec5;
          uVar4 = uVar3 - 1;
          if (uVar8 != uVar4) {
            ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,", ",2);
            lVar7 = *(long *)(this + 0x730);
            uVar3 = (*(long *)(this + 0x738) - lVar7 >> 4) * 0x4ec4ec4ec4ec4ec5;
            pPVar6 = extraout_RDX_02;
          }
          indent = (uint32_t)uVar4;
          uVar8 = uVar8 + 1;
          lVar9 = lVar9 + 0xd0;
        } while (uVar8 < uVar3);
      }
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"]",1);
      uVar8 = local_1f0;
      __return_storage_ptr__ = local_1e8;
    }
    bVar1 = AttrMetas::authored((AttrMetas *)(this + 0x750));
    if (bVar1) {
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"(\n",2);
      print_attr_metas_abi_cxx11_
                (&local_218,this + 0x750,(AttrMeta *)(ulong)((int)uVar8 + 2),indent);
      poVar2 = ::std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,local_218._M_dataplus._M_p,local_218._M_string_length);
      pprint::Indent_abi_cxx11_(&local_1d8,(pprint *)(ulong)local_1f4,n_01);
      poVar2 = ::std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
    }
    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
    uVar5 = extraout_EDX_05;
  }
  if (this[0x978] == (tinyusdz)0x1) {
    local_1f4 = (int)uVar8 + 1;
    pprint::Indent_abi_cxx11_(&local_218,(pprint *)(ulong)local_1f4,uVar5);
    poVar2 = ::std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,local_218._M_dataplus._M_p,local_218._M_string_length);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,"token outputs:displacement.connect ",0x23);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
    }
    if (*(long *)(this + 0x968) - *(long *)(this + 0x960) == 0xd0) {
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"= ",2);
      (anonymous_namespace)::pquote_abi_cxx11_
                (&local_218,*(_anonymous_namespace_ **)(this + 0x960),p_00);
      ::std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,local_218._M_dataplus._M_p,local_218._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
    }
    else if (1 < (ulong)((*(long *)(this + 0x968) - *(long *)(this + 0x960) >> 4) *
                        0x4ec4ec4ec4ec4ec5)) {
      local_1f0 = uVar8;
      local_1e8 = __return_storage_ptr__;
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"= [",3);
      lVar7 = *(long *)(this + 0x960);
      if (*(long *)(this + 0x968) != lVar7) {
        lVar9 = 0;
        uVar8 = 0;
        pPVar6 = extraout_RDX_03;
        do {
          (anonymous_namespace)::pquote_abi_cxx11_
                    (&local_218,(_anonymous_namespace_ *)(lVar7 + lVar9),pPVar6);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    (local_1a8,local_218._M_dataplus._M_p,local_218._M_string_length);
          pPVar6 = extraout_RDX_04;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_218._M_dataplus._M_p != &local_218.field_2) {
            operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
            pPVar6 = extraout_RDX_05;
          }
          lVar7 = *(long *)(this + 0x960);
          uVar3 = (*(long *)(this + 0x968) - lVar7 >> 4) * 0x4ec4ec4ec4ec4ec5;
          uVar4 = uVar3 - 1;
          if (uVar8 != uVar4) {
            ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,", ",2);
            lVar7 = *(long *)(this + 0x960);
            uVar3 = (*(long *)(this + 0x968) - lVar7 >> 4) * 0x4ec4ec4ec4ec4ec5;
            pPVar6 = extraout_RDX_06;
          }
          indent = (uint32_t)uVar4;
          uVar8 = uVar8 + 1;
          lVar9 = lVar9 + 0xd0;
        } while (uVar8 < uVar3);
      }
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"]",1);
      uVar8 = local_1f0;
      __return_storage_ptr__ = local_1e8;
    }
    bVar1 = AttrMetas::authored((AttrMetas *)(this + 0x980));
    if (bVar1) {
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"(\n",2);
      print_attr_metas_abi_cxx11_
                (&local_218,this + 0x980,(AttrMeta *)(ulong)((int)uVar8 + 2),indent);
      poVar2 = ::std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,local_218._M_dataplus._M_p,local_218._M_string_length);
      pprint::Indent_abi_cxx11_(&local_1d8,(pprint *)(ulong)local_1f4,n_02);
      poVar2 = ::std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
    }
    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
    uVar5 = extraout_EDX_06;
  }
  if (this[0xba8] == (tinyusdz)0x0) {
    indent_00 = (int)uVar8 + 1;
  }
  else {
    indent_00 = (int)uVar8 + 1;
    pprint::Indent_abi_cxx11_(&local_218,(pprint *)(ulong)indent_00,uVar5);
    poVar2 = ::std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,local_218._M_dataplus._M_p,local_218._M_string_length);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,"token outputs:volume.connect ",0x1d);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
    }
    if (*(long *)(this + 0xb98) - *(long *)(this + 0xb90) == 0xd0) {
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"= ",2);
      (anonymous_namespace)::pquote_abi_cxx11_
                (&local_218,*(_anonymous_namespace_ **)(this + 0xb90),p_01);
      ::std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,local_218._M_dataplus._M_p,local_218._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
    }
    else if (1 < (ulong)((*(long *)(this + 0xb98) - *(long *)(this + 0xb90) >> 4) *
                        0x4ec4ec4ec4ec4ec5)) {
      local_1f4 = indent_00;
      local_1f0 = uVar8;
      local_1e8 = __return_storage_ptr__;
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"= [",3);
      lVar7 = *(long *)(this + 0xb90);
      if (*(long *)(this + 0xb98) != lVar7) {
        lVar9 = 0;
        uVar8 = 0;
        pPVar6 = extraout_RDX_07;
        do {
          (anonymous_namespace)::pquote_abi_cxx11_
                    (&local_218,(_anonymous_namespace_ *)(lVar7 + lVar9),pPVar6);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    (local_1a8,local_218._M_dataplus._M_p,local_218._M_string_length);
          pPVar6 = extraout_RDX_08;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_218._M_dataplus._M_p != &local_218.field_2) {
            operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
            pPVar6 = extraout_RDX_09;
          }
          lVar7 = *(long *)(this + 0xb90);
          uVar3 = (*(long *)(this + 0xb98) - lVar7 >> 4) * 0x4ec4ec4ec4ec4ec5;
          uVar4 = uVar3 - 1;
          if (uVar8 != uVar4) {
            ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,", ",2);
            lVar7 = *(long *)(this + 0xb90);
            uVar3 = (*(long *)(this + 0xb98) - lVar7 >> 4) * 0x4ec4ec4ec4ec4ec5;
            pPVar6 = extraout_RDX_10;
          }
          indent = (uint32_t)uVar4;
          uVar8 = uVar8 + 1;
          lVar9 = lVar9 + 0xd0;
        } while (uVar8 < uVar3);
      }
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"]",1);
      uVar8 = local_1f0;
      __return_storage_ptr__ = local_1e8;
      indent_00 = local_1f4;
    }
    bVar1 = AttrMetas::authored((AttrMetas *)(this + 0xbb0));
    if (bVar1) {
      local_1e8 = __return_storage_ptr__;
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"(\n",2);
      local_1f0 = uVar8;
      print_attr_metas_abi_cxx11_
                (&local_218,this + 0xbb0,(AttrMeta *)(ulong)((int)uVar8 + 2),indent);
      poVar2 = ::std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,local_218._M_dataplus._M_p,local_218._M_string_length);
      pprint::Indent_abi_cxx11_(&local_1d8,(pprint *)(ulong)indent_00,n_03);
      poVar2 = ::std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
      }
      uVar8 = local_1f0;
      __return_storage_ptr__ = local_1e8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
        uVar8 = local_1f0;
        __return_storage_ptr__ = local_1e8;
      }
    }
    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
  }
  print_props(&local_218,
              (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
               *)(this + 0x6d0),indent_00);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_218._M_dataplus._M_p,local_218._M_string_length);
  uVar5 = extraout_EDX_07;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
    uVar5 = extraout_EDX_08;
  }
  if ((char)local_1dc != '\0') {
    pprint::Indent_abi_cxx11_(&local_218,(pprint *)(uVar8 & 0xffffffff),uVar5);
    poVar2 = ::std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,local_218._M_dataplus._M_p,local_218._M_string_length);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar2,"}\n",2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
    }
  }
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const Material &material, const uint32_t indent,
                      bool closing_brace) {
  std::stringstream ss;

  ss << pprint::Indent(indent) << to_string(material.spec) << " Material \""
     << material.name << "\"\n";
  if (material.meta.authored()) {
    ss << pprint::Indent(indent) << "(\n";
    ss << print_prim_metas(material.meta, indent + 1);
    ss << pprint::Indent(indent) << ")\n";
  }
  ss << pprint::Indent(indent) << "{\n";

  if (material.surface.authored()) {
    // assume connection when authored.
    // TODO: list edit?.
    ss << pprint::Indent(indent + 1) << "token outputs:surface.connect ";

    const auto &conns = material.surface.get_connections();
    if (conns.size() == 1) {
      ss << "= " << pquote(conns[0]);
    } else if (conns.size() > 1) {
      ss << "= [";
      for (size_t i = 0; i < conns.size(); i++) {
        ss << pquote(conns[i]);
        if (i != (conns.size() - 1)) {
          ss << ", ";
        }
      }
      ss << "]";
    }

    if (material.surface.metas().authored()) {
      ss << "(\n"
         << print_attr_metas(material.surface.metas(), indent + 2)
         << pprint::Indent(indent + 1) << ")";
    }
    ss << "\n";
  }

  if (material.displacement.authored()) {
    // assume connection when authored.
    // TODO: list edit?.
    ss << pprint::Indent(indent + 1) << "token outputs:displacement.connect ";

    const auto &conns = material.displacement.get_connections();
    if (conns.size() == 1) {
      ss << "= " << pquote(conns[0]);
    } else if (conns.size() > 1) {
      ss << "= [";
      for (size_t i = 0; i < conns.size(); i++) {
        ss << pquote(conns[i]);
        if (i != (conns.size() - 1)) {
          ss << ", ";
        }
      }
      ss << "]";
    }

    if (material.displacement.metas().authored()) {
      ss << "(\n"
         << print_attr_metas(material.displacement.metas(), indent + 2)
         << pprint::Indent(indent + 1) << ")";
    }
    ss << "\n";
  }

  if (material.volume.authored()) {
    // assume connection when authored.
    // TODO: list edit?.
    ss << pprint::Indent(indent + 1) << "token outputs:volume.connect ";

    const auto &conns = material.volume.get_connections();
    if (conns.size() == 1) {
      ss << "= " << pquote(conns[0]);
    } else if (conns.size() > 1) {
      ss << "= [";
      for (size_t i = 0; i < conns.size(); i++) {
        ss << pquote(conns[i]);
        if (i != (conns.size() - 1)) {
          ss << ", ";
        }
      }
      ss << "]";
    }

    if (material.volume.metas().authored()) {
      ss << "(\n"
         << print_attr_metas(material.volume.metas(), indent + 2)
         << pprint::Indent(indent + 1) << ")";
    }
    ss << "\n";
  }

  ss << print_props(material.props, indent + 1);

  if (closing_brace) {
    ss << pprint::Indent(indent) << "}\n";
  }

  return ss.str();
}